

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

PSocketAddress * p_socket_get_local_address(PSocket *socket,PError **error)

{
  int iVar1;
  pint pVar2;
  PErrorIO code;
  PSocketAddress *pPVar3;
  char *message;
  socklen_t len;
  sockaddr_storage buffer;
  socklen_t local_9c;
  sockaddr local_98 [8];
  
  if (socket == (PSocket *)0x0) {
    message = "Invalid input argument";
    pVar2 = 0x1fb;
  }
  else {
    local_9c = 0x80;
    iVar1 = getsockname(socket->fd,local_98,&local_9c);
    if (iVar1 < 0) {
      pVar2 = p_error_get_last_net();
      code = p_error_get_io_from_system(pVar2);
      pVar2 = p_error_get_last_net();
      p_error_set_error_p(error,code,pVar2,
                          "Failed to call getsockname() to get local socket address");
      return (PSocketAddress *)0x0;
    }
    pPVar3 = p_socket_address_new_from_native(local_98,(ulong)local_9c);
    if (pPVar3 != (PSocketAddress *)0x0) {
      return pPVar3;
    }
    message = "Failed to create socket address from native structure";
    pVar2 = 0x20a;
  }
  p_error_set_error_p(error,pVar2,0,message);
  return (PSocketAddress *)0x0;
}

Assistant:

P_LIB_API PSocketAddress *
p_socket_get_local_address (const PSocket	*socket,
			    PError		**error)
{
	struct sockaddr_storage	buffer;
	socklen_t		len;
	PSocketAddress		*ret;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	len = sizeof (buffer);

	if (P_UNLIKELY (getsockname (socket->fd, (struct sockaddr *) &buffer, &len) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call getsockname() to get local socket address");
		return NULL;
	}

	ret = p_socket_address_new_from_native (&buffer, (psize) len);

	if (P_UNLIKELY (ret == NULL))
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to create socket address from native structure");

	return ret;
}